

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O1

void sound_byte(ubyte iobyte)

{
  if (iobyte < 0xe0) {
    if ((iobyte & 0x90) == 0x80) {
      get_freq(iobyte);
    }
    else if ((iobyte & 0x90) == 0x90) {
      vol[(ulong)(iobyte >> 5 & 3) ^ 3] = ~iobyte & 0xf;
    }
    if (-1 < (char)iobyte) {
      get_freq(iobyte);
    }
    if (soundyesno != '\0') {
      update_sound();
      return;
    }
  }
  return;
}

Assistant:

void sound_byte(ubyte iobyte) {      // if a noise program byte, return
    if ((iobyte & 0xE0) == 0xE0) return;

    if ((iobyte & 0x90) == 0x90) get_vol(iobyte);  // if a volume byte
    if ((iobyte & 0x90) == 0x80) get_freq(iobyte); // if a frequency byte
    if (!(iobyte & 0x80)) get_freq(iobyte);      // if a frequency byte
    if (soundyesno) update_sound();            // update sound

}